

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_4> * tcu::operator+(Matrix<float,_4,_4> *a,Matrix<float,_4,_4> *b)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  Matrix<float,_4,_4> *res;
  float *in_RDI;
  float *pfVar10;
  int row;
  long lVar11;
  long lVar12;
  undefined4 uVar13;
  
  *(undefined8 *)(in_RDI + 0xc) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  *(undefined8 *)(in_RDI + 2) = 0;
  lVar9 = 0;
  lVar11 = 0;
  pfVar10 = in_RDI;
  do {
    lVar12 = 0;
    do {
      uVar13 = 0x3f800000;
      if (lVar9 != lVar12) {
        uVar13 = 0;
      }
      *(undefined4 *)((long)pfVar10 + lVar12) = uVar13;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar11 = lVar11 + 1;
    pfVar10 = pfVar10 + 1;
    lVar9 = lVar9 + 0x10;
  } while (lVar11 != 4);
  lVar9 = 0;
  do {
    pfVar10 = (float *)((long)(a->m_data).m_data[0].m_data + lVar9);
    fVar3 = pfVar10[1];
    fVar4 = pfVar10[2];
    fVar5 = pfVar10[3];
    pfVar1 = (float *)((long)(b->m_data).m_data[0].m_data + lVar9);
    fVar6 = pfVar1[1];
    fVar7 = pfVar1[2];
    fVar8 = pfVar1[3];
    pfVar2 = (float *)((long)in_RDI + lVar9);
    *pfVar2 = *pfVar1 + *pfVar10;
    pfVar2[1] = fVar6 + fVar3;
    pfVar2[2] = fVar7 + fVar4;
    pfVar2[3] = fVar8 + fVar5;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  return (Matrix<float,_4,_4> *)in_RDI;
}

Assistant:

Matrix<T, Rows, Cols> operator+ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) + b(row, col);
	return res;
}